

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g80_atom32.cc
# Opt level: O1

int test_atom32(hwtest_ctx *ctx)

{
  unsigned_short *__xsubi;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  nva_card **ppnVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  char local_1848;
  uint32_t src1 [512];
  uint32_t src3 [512];
  uint32_t src2 [512];
  uint auStack_38 [2];
  
  __xsubi = ctx->rand48;
  iVar14 = 0;
  do {
    lVar9 = jrand48(__xsubi);
    uVar22 = (uint)lVar9 & 0xfff0000 | 0xd0000015;
    uVar10 = jrand48(__xsubi);
    uVar18 = (uint)uVar10;
    uVar15 = uVar18 & 0x3ffff03c | 0xc00007c0;
    lVar9 = jrand48(__xsubi);
    uVar7 = (uint)(uVar10 >> 2) & 0xf;
    if ((uVar18 >> 0x1d & 1) == 0) {
      bVar24 = false;
      if (uVar7 != 2) goto LAB_002c5c4e;
    }
    else {
      uVar22 = uVar22 & 0xdf800001 | 0x5001c;
      if (uVar7 == 2) {
        uVar15 = uVar18 & 0x3f20303c | 0xc0c187c0;
      }
LAB_002c5c4e:
      bVar24 = false;
      if (uVar7 != 3 && (uVar18 & 0xc00000) != 0x800000) {
        iVar8 = g80_gr_mthd(ctx,3,0x3a8,0x40);
        bVar24 = true;
        if ((iVar8 == 0) && (iVar8 = g80_gr_mthd(ctx,3,0x3ac,0x10200), iVar8 == 0)) {
          bVar24 = true;
          iVar8 = g80_gr_mthd(ctx,3,0x3b0,1);
          if ((iVar8 == 0) &&
             ((iVar8 = g80_gr_mthd(ctx,3,0x2c0,8), iVar8 == 0 &&
              (iVar8 = g80_gr_mthd(ctx,3,0x2b4,0x10200), iVar8 == 0)))) {
            bVar24 = true;
            iVar8 = g80_gr_mthd(ctx,3,0x2b8,1);
            if ((iVar8 == 0) && (iVar8 = g80_gr_mthd(ctx,3,0x3b8,2), iVar8 == 0)) {
              bVar24 = true;
              iVar8 = g80_gr_mthd(ctx,3,0x2f8,1);
              if (((((iVar8 == 0) && (iVar8 = g80_gr_mthd(ctx,3,0x388,0), iVar8 == 0)) &&
                   (iVar8 = g80_gr_mthd(ctx,3,0x3a4,0x10001), iVar8 == 0)) &&
                  ((iVar8 = g80_gr_mthd(ctx,3,0x374,0), iVar8 == 0 &&
                   (iVar8 = g80_gr_mthd(ctx,3,900,0x100), iVar8 == 0)))) &&
                 (iVar8 = g80_gr_mthd(ctx,3,0x37c,((uint)lVar9 & 2) << 0xf | (uint)lVar9 & 1),
                 ppnVar6 = nva_cards, iVar8 == 0)) {
                src1[0] = 0x30020001;
                src1[1] = 0xc4100780;
                src1[2] = 0x20008005;
                src1[3] = 0x83;
                src1[4] = 0x20008009;
                src1[5] = 0x103;
                src1[6] = 0x2000800d;
                src1[7] = 0x183;
                src1[8] = 0x100f8011;
                src1[9] = 3;
                src1[10] = 0x801;
                src1[0xb] = 0xa0000780;
                src1[0xc] = 0xd0000215;
                src1[0xd] = 0x80c00780;
                src1[0xe] = 0xd0000419;
                src1[0xf] = 0x80c00780;
                src1[0x10] = uVar22;
                src1[0x11] = uVar15;
                src1[0x12] = 0xd000041d;
                src1[0x13] = 0xa0c00780;
                src1[0x14] = 0x1d;
                src1[0x15] = 0x20000780;
                src1[0x16] = 0xd000021d;
                src1[0x17] = 0xa0c00780;
                src1[0x18] = 0xf0000001;
                src1[0x19] = 0xe0000781;
                *(undefined4 *)((long)nva_cards[ctx->cnum]->bar0 + 0x1700) = 0x100;
                lVar9 = 0;
                do {
                  *(uint32_t *)((long)ppnVar6[ctx->cnum]->bar0 + lVar9 * 4 + 0x730000) = src1[lVar9]
                  ;
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 0x1a);
                *(undefined4 *)((long)ppnVar6[ctx->cnum]->bar0 + 0x70000) = 1;
                do {
                } while (*(int *)((long)ppnVar6[ctx->cnum]->bar0 + 0x70000) != 0);
                iVar8 = g80_gr_mthd(ctx,3,0x380,0);
                if (iVar8 == 0) {
                  uVar10 = jrand48(__xsubi);
                  lVar9 = 0;
                  do {
                    lVar11 = jrand48(__xsubi);
                    src1[lVar9] = (uint32_t)lVar11;
                    lVar12 = jrand48(__xsubi);
                    src2[lVar9] = (uint32_t)lVar12;
                    lVar13 = jrand48(__xsubi);
                    ppnVar6 = nva_cards;
                    src3[lVar9] = (uint32_t)lVar13;
                    if ((uVar10 & 1) != 0) {
                      src1[lVar9] = (int)(char)lVar11;
                    }
                    if ((uVar10 & 2) != 0) {
                      local_1848 = (char)lVar12;
                      src2[lVar9] = (int)local_1848;
                    }
                    if ((uVar10 & 4) != 0) {
                      src3[lVar9] = (int)(char)lVar13;
                    }
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 0x200);
                  *(undefined4 *)((long)nva_cards[ctx->cnum]->bar0 + 0x1700) = 0x200;
                  lVar9 = 0;
                  do {
                    *(undefined4 *)((long)ppnVar6[ctx->cnum]->bar0 + lVar9 + 0x700000) =
                         *(undefined4 *)((long)src1 + lVar9);
                    *(undefined4 *)((long)ppnVar6[ctx->cnum]->bar0 + lVar9 + 0x700800) =
                         *(undefined4 *)((long)src2 + lVar9);
                    *(undefined4 *)((long)ppnVar6[ctx->cnum]->bar0 + lVar9 + 0x701000) =
                         *(undefined4 *)((long)src3 + lVar9);
                    lVar9 = lVar9 + 4;
                  } while (lVar9 != 0x800);
                  *(undefined4 *)((long)ppnVar6[ctx->cnum]->bar0 + 0x70000) = 1;
                  do {
                  } while (*(int *)((long)ppnVar6[ctx->cnum]->bar0 + 0x70000) != 0);
                  iVar8 = g80_gr_mthd(ctx,3,0x368,0);
                  bVar24 = true;
                  if ((iVar8 == 0) && (iVar8 = g80_gr_idle(ctx), iVar8 == 0)) {
                    pvVar5 = nva_cards[ctx->cnum]->bar0;
                    uVar18 = uVar15 >> 2 & 0xf;
                    uVar7 = uVar15 >> 0x15 & 7;
                    lVar9 = -0x200;
                    do {
                      uVar1 = *(uint *)((long)pvVar5 + lVar9 * 4 + 0x700800);
                      uVar2 = *(uint *)((long)pvVar5 + lVar9 * 4 + 0x701000);
                      uVar3 = *(uint *)((long)pvVar5 + lVar9 * 4 + 0x701800);
                      uVar4 = src3[lVar9];
                      uVar10 = (ulong)uVar4;
                      uVar16 = auStack_38[lVar9];
                      uVar17 = (ulong)uVar16;
                      if (1 < uVar7) {
                        if (uVar7 < 4) {
                          uVar16 = uVar16 << 0x10 | uVar16 & 0xffff;
                        }
                        uVar23 = (ulong)uVar16;
                        switch(uVar18) {
                        case 0:
                          goto switchD_002c6117_caseD_0;
                        case 1:
                          goto switchD_002c6117_caseD_1;
                        case 2:
                          goto switchD_002c6117_caseD_2;
                        case 3:
                          goto switchD_002c6117_caseD_3;
                        case 4:
                          goto switchD_002c6117_caseD_4;
                        case 5:
                          goto switchD_002c6117_caseD_5;
                        case 6:
                          goto switchD_002c6117_caseD_6;
                        case 7:
                          goto switchD_002c6117_caseD_7;
                        default:
                          goto switchD_002c6117_caseD_8;
                        case 10:
                          goto switchD_002c6117_caseD_a;
                        case 0xb:
                          goto switchD_002c6117_caseD_b;
                        case 0xc:
                          goto switchD_002c6117_caseD_c;
                        }
                      }
                      uVar16 = (uVar16 & 0xff) * 0x1010101;
                      uVar23 = (ulong)uVar16;
                      switch(uVar18) {
                      case 0:
switchD_002c6117_caseD_0:
                        uVar16 = uVar16 + uVar4;
                        break;
                      case 1:
                        goto switchD_002c6117_caseD_1;
                      case 2:
switchD_002c6117_caseD_2:
                        uVar23 = (ulong)src2[lVar9];
                        if (uVar4 != uVar16) goto switchD_002c6117_caseD_8;
                        goto switchD_002c6117_caseD_1;
                      case 3:
switchD_002c6117_caseD_3:
                        abort();
                      case 4:
switchD_002c6117_caseD_4:
                        uVar20 = uVar4 + 1;
                        uVar23 = 0;
                        if (uVar20 <= uVar16) {
                          uVar23 = (ulong)uVar20;
                        }
                        if (((uVar7 == 7) && ((ctx->chipset).chipset < 0xa0)) && ((int)uVar16 < 0))
                        {
                          if ((int)uVar20 < (int)uVar16) {
                            uVar20 = uVar16;
                          }
                          if (uVar4 < 0x7fffffff) {
                            uVar20 = uVar16;
                          }
                          uVar23 = (ulong)uVar20;
                        }
                        goto switchD_002c6117_caseD_1;
                      case 5:
switchD_002c6117_caseD_5:
                        uVar19 = uVar4 - 1;
                        uVar20 = uVar16;
                        if (uVar19 < uVar16) {
                          uVar20 = uVar19;
                        }
                        uVar23 = (ulong)uVar20;
                        if (((uVar7 == 7) && ((ctx->chipset).chipset < 0xa0)) && ((int)uVar16 < 0))
                        {
                          uVar20 = 0;
                          if ((int)uVar16 <= (int)uVar19) {
                            uVar20 = uVar19;
                          }
                          uVar23 = (ulong)uVar20;
                          if (0 < (int)uVar19) {
                            uVar23 = 0;
                          }
                        }
                        goto switchD_002c6117_caseD_1;
                      case 6:
switchD_002c6117_caseD_6:
                        if (uVar7 == 7) {
                          if ((int)uVar16 < (int)uVar4) {
                            uVar16 = uVar4;
                          }
                        }
                        else if (uVar16 < uVar4) {
                          uVar16 = uVar4;
                        }
                        break;
                      case 7:
switchD_002c6117_caseD_7:
                        if (uVar7 == 7) {
                          if ((int)uVar4 < (int)uVar16) {
                            uVar16 = uVar4;
                          }
                        }
                        else if (uVar4 < uVar16) {
                          uVar16 = uVar4;
                        }
                        break;
                      default:
switchD_002c6117_caseD_8:
                        uVar23 = uVar10;
                        goto switchD_002c6117_caseD_1;
                      case 10:
switchD_002c6117_caseD_a:
                        uVar16 = uVar16 & uVar4;
                        break;
                      case 0xb:
switchD_002c6117_caseD_b:
                        uVar16 = uVar16 | uVar4;
                        break;
                      case 0xc:
switchD_002c6117_caseD_c:
                        uVar16 = uVar16 ^ uVar4;
                      }
                      uVar23 = (ulong)uVar16;
switchD_002c6117_caseD_1:
                      if ((uVar7 < 4) && (0x9f < (ctx->chipset).chipset)) {
                        uVar23 = (ulong)uVar4;
                      }
                      uVar21 = uVar10;
                      switch(uVar7) {
                      case 0:
                        uVar21 = (ulong)(uVar4 & 0xff);
                        break;
                      case 1:
                        uVar21 = (ulong)(uint)(int)(char)uVar4;
                        break;
                      case 2:
                        uVar21 = (ulong)(uVar4 & 0xffff);
                        break;
                      case 3:
                        uVar21 = (ulong)(uint)(int)(short)uVar4;
                      }
                      bVar24 = uVar3 != (uint)uVar21 && 0xdfffffff < uVar15 ||
                               (uVar2 != 0xf || uVar1 != (uint)uVar23);
                      if (bVar24) {
                        printf("atom32 %08x %08x (%08x %08x %08x %08x)[%d]: got %08x.%x %08x expected %08x.%x %08x\n"
                               ,(ulong)uVar22,(ulong)uVar15,uVar10,uVar17,(ulong)src2[lVar9],uVar10,
                               (ulong)((int)lVar9 + 0x200U & 3),(ulong)uVar1,(ulong)uVar2,
                               (ulong)uVar3,uVar23,0xf,uVar21);
                        break;
                      }
                      lVar9 = lVar9 + 1;
                    } while (lVar9 != 0);
                  }
                }
              }
            }
          }
        }
      }
    }
    if (bVar24) {
      return 3;
    }
    iVar14 = iVar14 + 1;
    if (iVar14 == 100000) {
      return 1;
    }
  } while( true );
}

Assistant:

static int test_atom32(struct hwtest_ctx *ctx) {
	int i;
	for (i = 0; i < 100000; i++) {
		uint32_t op1 = 0xd0000015 | (jrand48(ctx->rand48) & 0x0fff0000);
		uint32_t op2 = 0xc00007c0 | (jrand48(ctx->rand48) & 0x3ffff03c);
		uint32_t xtra = jrand48(ctx->rand48);
		int op = op2 >> 2 & 0xf;
		int sz = op2 >> 21 & 7;
		if (op2 & 0x20000000) {
			/* if atom, use different operands than red */
			op1 &= ~0x7f01fc;
			op1 |= 0x05001c;
			if (op == 2) {
				/* cas selected, aim the third source */
				op2 &= ~0x001fc000;
				op2 |= 0x00018000;
				/* and make sure b32 is used */
				op2 |= 0x00c00000;
			}
		} else if (op == 2) {
			/* red cas selected, bail */
			continue;
		}
		/* bail if b64 or b128 selected */
		if (sz == 4 || sz == 5)
			continue;
		/* op 3 is a trap */
		if (op == 3)
			continue;
		if (atom32_prep_grid(ctx, xtra))
			return HWTEST_RES_FAIL;
		if (atom32_prep_code(ctx, op1, op2))
				return HWTEST_RES_FAIL;
		uint32_t src1[0x200], src2[0x200], src3[0x200];
		atom32_gen(ctx, src1, src2, src3);
		if (atom32_test(ctx, op1, op2, src1, src2, src3, xtra))
			return HWTEST_RES_FAIL;
	}
	return HWTEST_RES_PASS;
}